

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcodecompile.cc
# Opt level: O0

Location * __thiscall Location::format_abi_cxx11_(Location *this)

{
  ostream *poVar1;
  void *this_00;
  string *in_RSI;
  ostringstream local_190 [8];
  ostringstream s;
  Location *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar1 = std::operator<<((ostream *)local_190,in_RSI);
  poVar1 = std::operator<<(poVar1,":");
  this_00 = (void *)std::ostream::operator<<(poVar1,std::dec);
  std::ostream::operator<<(this_00,*(int *)(in_RSI + 0x20));
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return this;
}

Assistant:

string Location::format(void) const

{
  ostringstream s;
  s << filename << ":" << dec << lineno;
  return s.str();
}